

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datset.cpp
# Opt level: O1

string * loadRandomImage(string *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  result_type rVar3;
  difference_type dVar4;
  ulong uVar5;
  long *plVar6;
  size_t __i;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  int iVar8;
  int iVar9;
  Mat *back;
  string s;
  uniform_int_distribution<int> intgen;
  random_device rd;
  mt19937 gen;
  directory_iterator local_27d0;
  directory_iterator local_27c0;
  undefined1 *local_27b0;
  undefined8 local_27a8;
  undefined1 local_27a0;
  undefined7 uStack_279f;
  directory_iterator local_2790;
  path local_2780;
  directory_iterator local_2758;
  uniform_int_distribution<int> local_2748;
  random_device local_2740;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&local_2740,in_RSI,auto_format);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            (&local_2790,(path *)&local_2740,none,(error_code *)0x0);
  local_2758._M_dir._M_ptr = (element_type *)0x0;
  local_2758._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dVar4 = std::
          count_if<std::filesystem::__cxx11::directory_iterator,bool(*)(std::filesystem::__cxx11::path_const&)>
                    (&local_2790,&local_2758,std::filesystem::is_regular_file);
  if (local_2758._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2758._M_dir._M_refcount._M_pi);
  }
  if (local_2790._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2790._M_dir._M_refcount._M_pi);
  }
  std::filesystem::__cxx11::path::~path((path *)&local_2740);
  std::random_device::random_device(&local_2740);
  uVar2 = std::random_device::_M_getval();
  local_13b8._M_x[0] = (unsigned_long)uVar2;
  lVar7 = 1;
  uVar5 = local_13b8._M_x[0];
  do {
    uVar5 = (ulong)(((uint)(uVar5 >> 0x1e) ^ (uint)uVar5) * 0x6c078965 + (int)lVar7);
    local_13b8._M_x[lVar7] = uVar5;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x270);
  local_13b8._M_p = 0x270;
  local_2748._M_param._M_b = (int)dVar4 + -1;
  local_2748._M_param._M_a = 0;
  rVar3 = std::uniform_int_distribution<int>::operator()
                    (&local_2748,&local_13b8,&local_2748._M_param);
  local_27b0 = &local_27a0;
  local_27a8 = 0;
  local_27a0 = 0;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_2780,in_RSI,auto_format);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            (&local_27c0,&local_2780,none,(error_code *)0x0);
  std::filesystem::__cxx11::path::~path(&local_2780);
  if (local_27c0._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_27c0._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_27c0._M_dir._M_refcount._M_pi + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_27c0._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_27c0._M_dir._M_refcount._M_pi + 8) + 1;
    }
  }
  local_27d0._M_dir._M_ptr = local_27c0._M_dir._M_ptr;
  local_27d0._M_dir._M_refcount._M_pi = local_27c0._M_dir._M_refcount._M_pi;
  if (local_27c0._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_27c0._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_27c0._M_dir._M_refcount._M_pi + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_27c0._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_27c0._M_dir._M_refcount._M_pi + 8) + 1;
    }
    if (local_27c0._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
    {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_27c0._M_dir._M_refcount._M_pi);
    }
  }
  paVar1 = &local_2780._M_pathname.field_2;
  iVar9 = 0;
  while (local_27d0._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
  {
    plVar6 = (long *)std::filesystem::__cxx11::directory_iterator::operator*(&local_27d0);
    if (iVar9 == rVar3) {
      local_2780._M_pathname._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>((string *)&local_2780,*plVar6,plVar6[1] + *plVar6);
      std::__cxx11::string::operator=((string *)&local_27b0,(string *)&local_2780);
      iVar8 = iVar9;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2780._M_pathname._M_dataplus._M_p != paVar1) {
        operator_delete(local_2780._M_pathname._M_dataplus._M_p,
                        local_2780._M_pathname.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      iVar8 = iVar9 + 1;
    }
    if (iVar9 == rVar3) break;
    std::filesystem::__cxx11::directory_iterator::operator++(&local_27d0);
    iVar9 = iVar8;
  }
  if (local_27d0._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_27d0._M_dir._M_refcount._M_pi);
  }
  if (local_27c0._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_27c0._M_dir._M_refcount._M_pi);
  }
  cv::imread((string *)path,(int)&local_27b0);
  if (local_27b0 != &local_27a0) {
    operator_delete(local_27b0,CONCAT71(uStack_279f,local_27a0) + 1);
  }
  std::random_device::_M_fini();
  return path;
}

Assistant:

cv::Mat loadRandomImage(string path) {
    using fp = bool (*)(const filesystem::path&);
    auto nfiles = count_if(filesystem::directory_iterator(path), filesystem::directory_iterator{}, (fp)filesystem::is_regular_file);
    random_device rd;  
    mt19937 gen(rd());
    uniform_int_distribution<> intgen(0, nfiles-1);
    auto n = intgen(gen);
    int i=0;
    string s;
    for (const auto & file: filesystem::directory_iterator(path)) {
        if (i == n) {
            s = file.path();
            break;
        }
        i++;
    }
    auto back = cv::imread(s);
    return back;
}